

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall TypeOpIntNegate::TypeOpIntNegate(TypeOpIntNegate *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"~","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_INT_NEGATE,&local_38);
  (this->super_TypeOpUnary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c0a68;
  (this->super_TypeOpUnary).metaout = TYPE_UINT;
  (this->super_TypeOpUnary).metain = TYPE_UINT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOpUnary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003bff50;
  (this->super_TypeOpUnary).super_TypeOp.opflags = 0x8000;
  (this->super_TypeOpUnary).super_TypeOp.addlflags = 1;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_NEGATE;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cb6f8;
  (this->super_TypeOpUnary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpIntNegate::TypeOpIntNegate(TypeFactory *t)
  : TypeOpUnary(t,CPUI_INT_NEGATE,"~",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::unary;
  addlflags = inherits_sign;
  behave = new OpBehaviorIntNegate();
}